

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O2

bool httplib::detail::read_headers(Stream *strm,Headers *headers)

{
  bool bVar1;
  __ssize_t _Var2;
  _Alloc_hider _Var3;
  FILE *in_RCX;
  size_t *in_RDX;
  size_t *extraout_RDX;
  size_t *extraout_RDX_00;
  Headers *__lineptr;
  Stream local_868;
  char buf [2048];
  stream_line_reader line_reader;
  
  line_reader.strm_ = &local_868;
  line_reader.fixed_buffer_ = (char *)0x800;
  line_reader.fixed_buffer_size_ = 0;
  line_reader.fixed_buffer_used_size_ = (size_t)&line_reader.glowable_buffer_._M_string_length;
  line_reader.glowable_buffer_._M_dataplus._M_p = (pointer)0x0;
  line_reader.glowable_buffer_._M_string_length._0_1_ = 0;
  __lineptr = headers;
  buf._2040_8_ = strm;
  while( true ) {
    _Var2 = stream_line_reader::getline
                      ((stream_line_reader *)(buf + 0x7f8),(char **)__lineptr,in_RDX,in_RCX);
    if ((char)_Var2 == '\0') break;
    bVar1 = stream_line_reader::end_with_crlf((stream_line_reader *)(buf + 0x7f8));
    in_RDX = extraout_RDX;
    if (bVar1) {
      _Var3 = line_reader.glowable_buffer_._M_dataplus;
      if (line_reader.glowable_buffer_._M_dataplus._M_p == (pointer)0x0) {
        _Var3._M_p = (pointer)line_reader.fixed_buffer_size_;
      }
      if (_Var3._M_p == (pointer)0x2) {
        bVar1 = true;
        goto LAB_0018770b;
      }
      if ((pointer)0x2000 < _Var3._M_p) break;
      in_RCX = (FILE *)&line_reader.fixed_buffer_used_size_;
      if (line_reader.glowable_buffer_._M_dataplus._M_p == (pointer)0x0) {
        in_RCX = (FILE *)&line_reader;
      }
      __lineptr = (Headers *)(*(char **)in_RCX + (long)_Var3._M_p + -2);
      parse_header<httplib::detail::read_headers(httplib::Stream&,std::multimap<std::__cxx11::string,std::__cxx11::string,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>&)::_lambda(std::__cxx11::string&&,std::__cxx11::string&&)_1_>
                (*(char **)in_RCX,(char *)__lineptr,(anon_class_8_1_b2c1a266)headers);
      in_RDX = extraout_RDX_00;
    }
  }
  bVar1 = false;
LAB_0018770b:
  std::__cxx11::string::~string((string *)&line_reader.fixed_buffer_used_size_);
  return bVar1;
}

Assistant:

inline bool read_headers(Stream& strm, Headers& headers) {
            const auto bufsiz = 2048;
            char buf[bufsiz];
            stream_line_reader line_reader(strm, buf, bufsiz);

            for (;;) {
                if (!line_reader.getline()) { return false; }

                // Check if the line ends with CRLF.
                auto line_terminator_len = 2;
                if (line_reader.end_with_crlf()) {
                    // Blank line indicates end of headers.
                    if (line_reader.size() == 2) { break; }
                #ifdef CPPHTTPLIB_ALLOW_LF_AS_LINE_TERMINATOR
                } else {
                    // Blank line indicates end of headers.
                    if (line_reader.size() == 1) { break; }
                    line_terminator_len = 1;
                }
            #else
            } else {
                    continue; // Skip invalid line.
                }